

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,SPxLPBase<double> *lp,int _i,bool lhsFixed,
          DataArray<bool> *fixCols,Array<double> *lo,Array<double> *up,
          shared_ptr<soplex::Tolerances> tols)

{
  int iVar1;
  undefined7 in_register_00000009;
  VectorBase<double> *pVVar2;
  long lVar3;
  long lVar4;
  int k;
  long lVar5;
  double dVar6;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
             tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  PostStep::PostStep(&this->super_PostStep,"ForceConstraint",
                     (shared_ptr<soplex::Tolerances> *)&local_40,
                     (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__ForceConstraintPS_0053e668;
  this->m_i = _i;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  pVVar2 = &(lp->super_LPRowSetBase<double>).right;
  if ((int)CONCAT71(in_register_00000009,lhsFixed) != 0) {
    pVVar2 = &(lp->super_LPRowSetBase<double>).left;
  }
  this->m_lRhs = (pVVar2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[_i];
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_row,
             (SVectorBase<double> *)
             ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx));
  Array<double>::Array
            (&this->m_objs,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx].data.
             super_SVectorBase<double>.memused);
  DataArray<bool>::DataArray(&this->m_fixed,fixCols);
  Array<soplex::DSVectorBase<double>_>::Array
            (&this->m_cols,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx].data.
             super_SVectorBase<double>.memused);
  this->m_lhsFixed = lhsFixed;
  this->m_maxSense = lp->thesense == MAXIMIZE;
  Array<double>::Array(&this->m_oldLowers,lo);
  Array<double>::Array(&this->m_oldUppers,up);
  this->m_lhs = (lp->super_LPRowSetBase<double>).left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  this->m_rhs = (lp->super_LPRowSetBase<double>).right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[_i];
  dVar6 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  if (lp->thesense == MINIMIZE) {
    dVar6 = -dVar6;
  }
  this->m_rowobj = dVar6;
  lVar4 = 8;
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < (this->m_row).super_SVectorBase<double>.memused; lVar5 = lVar5 + 1) {
    iVar1 = *(int *)((long)&((this->m_row).super_SVectorBase<double>.m_elem)->val + lVar4);
    (this->m_objs).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] =
         -(lp->super_LPColSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar1];
    DSVectorBase<double>::operator=
              ((DSVectorBase<double> *)
               ((long)&((this->m_cols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_vptr_DSVectorBase + lVar3),
               (SVectorBase<double> *)
               ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
               (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar1].idx));
    lVar3 = lVar3 + 0x20;
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

ForceConstraintPS(const SPxLPBase<R>& lp, int _i, bool lhsFixed,
                        DataArray<bool>& fixCols,
                        Array<R>& lo, Array<R>& up, std::shared_ptr<Tolerances> tols)
         : PostStep("ForceConstraint", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_lRhs(lhsFixed ? lp.lhs(_i) : lp.rhs(_i))
         , m_row(lp.rowVector(_i))
         , m_objs(lp.rowVector(_i).size())
         , m_fixed(fixCols)
         , m_cols(lp.rowVector(_i).size())
         , m_lhsFixed(lhsFixed)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_oldLowers(lo)
         , m_oldUppers(up)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_rowobj(lp.rowObj(_i))
      {
         for(int k = 0; k < m_row.size(); ++k)
         {
            m_objs[k] = (lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(m_row.index(k)) : -lp.obj(m_row.index(
                            k)));
            m_cols[k] = lp.colVector(m_row.index(k));
         }
      }